

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locator.cpp
# Opt level: O2

string * __thiscall
DSDcc::Locator::toString_abi_cxx11_(string *__return_storage_ptr__,Locator *this)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  return __return_storage_ptr__;
}

Assistant:

std::string Locator::toString() const
{
  std::string returned = "";

  returned.append(1,m_lon_array1[m_lon_index1]);
  returned.append(1,m_lat_array1[m_lat_index1]);
  returned.append(1,m_lon_array2[m_lon_index2]);
  returned.append(1,m_lat_array2[m_lat_index2]);
  returned.append(1,m_lon_array3[m_lon_index3]);
  returned.append(1,m_lat_array3[m_lat_index3]);

  return returned;
}